

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

void pstore::command_line::
     apply_to_option<pstore::command_line::alias&,char_const(&)[7],pstore::command_line::aliasopt_const&>
               (alias *opt,char (*m0) [7],aliasopt *mods)

{
  string sStack_38;
  
  make_modifier((name *)&sStack_38,*m0);
  option::set_name(&opt->super_option,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  aliasopt::apply(mods,opt);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }